

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_read_filter_row_sub(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(row_info->pixel_depth + 7 >> 3);
  lVar2 = 0;
  lVar1 = row_info->rowbytes - uVar3;
  if (row_info->rowbytes < uVar3) {
    lVar1 = lVar2;
  }
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    row[lVar2 + uVar3] = row[lVar2 + uVar3] + row[lVar2];
  }
  return;
}

Assistant:

static void
png_read_filter_row_sub(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   png_size_t i;
   png_size_t istop = row_info->rowbytes;
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   png_bytep rp = row + bpp;

   PNG_UNUSED(prev_row)

   for (i = bpp; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) + (int)(*(rp-bpp))) & 0xff);
      rp++;
   }
}